

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void deqp::gls::ub::anon_unknown_12::copyUniformData
               (UniformLayout *dstLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *dstBlockPointers,UniformLayout *srcLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *srcBlockPointers)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  int iVar4;
  DataType DVar5;
  long lVar6;
  pointer pUVar7;
  pointer pUVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  _Base_ptr p_Var15;
  int iVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  int *piVar19;
  void *__dest;
  int iVar20;
  _Rb_tree_header *p_Var21;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *pmVar22;
  int iVar23;
  int iVar24;
  pointer pBVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  void *__src;
  
  uVar9 = (uint)((ulong)((long)(srcLayout->blocks).
                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(srcLayout->blocks).
                              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar9) {
    p_Var1 = &(srcBlockPointers->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = &(dstBlockPointers->_M_t)._M_impl.super__Rb_tree_header;
    uVar26 = 0;
    do {
      p_Var17 = (srcBlockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var15 = &p_Var1->_M_header;
      p_Var18 = &p_Var1->_M_header;
      if (p_Var17 != (_Base_ptr)0x0) {
        do {
          if ((long)uVar26 <= (long)(int)p_Var17[1]._M_color) {
            p_Var15 = p_Var17;
          }
          p_Var17 = (&p_Var17->_M_left)[(long)(int)p_Var17[1]._M_color < (long)uVar26];
        } while (p_Var17 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
           (p_Var18 = p_Var15, (long)uVar26 < (long)(int)p_Var15[1]._M_color)) {
          p_Var18 = &p_Var1->_M_header;
        }
      }
      pBVar25 = (srcLayout->blocks).
                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar26;
      p_Var17 = p_Var18[1]._M_parent;
      iVar10 = UniformLayout::getBlockIndex(dstLayout,(pBVar25->name)._M_dataplus._M_p);
      if (-1 < iVar10) {
        p_Var15 = (dstBlockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var18 = &p_Var2->_M_header;
        pmVar22 = dstBlockPointers + 1;
        if (p_Var15 != (_Base_ptr)0x0) {
          do {
            if (iVar10 <= (int)*(size_t *)(p_Var15 + 1)) {
              p_Var18 = p_Var15;
            }
            p_Var15 = (&p_Var15->_M_left)[(int)*(size_t *)(p_Var15 + 1) < iVar10];
          } while (p_Var15 != (_Base_ptr)0x0);
          p_Var21 = p_Var2;
          if (((_Rb_tree_header *)p_Var18 != p_Var2) &&
             (p_Var21 = (_Rb_tree_header *)p_Var18,
             iVar10 < (int)((_Rb_tree_header *)p_Var18)->_M_node_count)) {
            p_Var21 = p_Var2;
          }
          pmVar22 = (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)(p_Var21 + 1);
        }
        piVar19 = *(int **)&(pBVar25->activeUniformIndices).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (piVar19 !=
            *(pointer *)
             ((long)&(pBVar25->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_> +
             8)) {
          lVar6 = *(long *)&(pmVar22->_M_t)._M_impl;
          do {
            iVar10 = *piVar19;
            pUVar7 = (srcLayout->uniforms).
                     super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = UniformLayout::getUniformIndex(dstLayout,pUVar7[iVar10].name._M_dataplus._M_p);
            if (-1 < (int)uVar11) {
              pUVar8 = (dstLayout->uniforms).
                       super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar3 = pUVar8[uVar11].offset;
              iVar4 = pUVar7[iVar10].offset;
              iVar12 = glu::getDataTypeScalarSize(pUVar8[uVar11].type);
              DVar5 = pUVar8[uVar11].type;
              if (0 < pUVar8[uVar11].size) {
                iVar28 = 0;
                do {
                  __dest = (void *)((long)(pUVar8[uVar11].arrayStride * iVar28) + iVar3 + lVar6);
                  __src = (void *)((long)&p_Var17->_M_color +
                                  (long)(pUVar7[iVar10].arrayStride * iVar28) + (long)iVar4);
                  if (DVar5 - TYPE_FLOAT_MAT2 < 9 || DVar5 - TYPE_DOUBLE_MAT2 < 9) {
                    iVar13 = glu::getDataTypeMatrixNumRows(pUVar8[uVar11].type);
                    iVar14 = glu::getDataTypeMatrixNumColumns(pUVar8[uVar11].type);
                    if (0 < iVar14) {
                      iVar16 = 0;
                      do {
                        if (0 < iVar13) {
                          iVar20 = 0;
                          iVar23 = 0;
                          do {
                            if (pUVar8[uVar11].isRowMajor == true) {
                              iVar24 = pUVar8[uVar11].matrixStride * iVar23 + iVar16 * 4;
                            }
                            else {
                              iVar24 = pUVar8[uVar11].matrixStride * iVar16 + iVar20;
                            }
                            if (pUVar7[iVar10].isRowMajor == true) {
                              iVar27 = pUVar7[iVar10].matrixStride * iVar23 + iVar16 * 4;
                            }
                            else {
                              iVar27 = pUVar7[iVar10].matrixStride * iVar16 + iVar20;
                            }
                            *(undefined4 *)((long)__dest + (long)iVar24) =
                                 *(undefined4 *)((long)__src + (long)iVar27);
                            iVar23 = iVar23 + 1;
                            iVar20 = iVar20 + 4;
                          } while (iVar13 != iVar23);
                        }
                        iVar16 = iVar16 + 1;
                      } while (iVar16 != iVar14);
                    }
                  }
                  else {
                    memcpy(__dest,__src,(long)(iVar12 << 2));
                  }
                  iVar28 = iVar28 + 1;
                } while (iVar28 < pUVar8[uVar11].size);
              }
            }
            piVar19 = piVar19 + 1;
          } while (piVar19 !=
                   *(pointer *)
                    ((long)&(pBVar25->activeUniformIndices).
                            super__Vector_base<int,_std::allocator<int>_> + 8));
        }
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uVar9 & 0x7fffffff));
  }
  return;
}

Assistant:

void copyUniformData (const UniformLayout& dstLayout, const std::map<int, void*>& dstBlockPointers, const UniformLayout& srcLayout, const std::map<int, void*>& srcBlockPointers)
{
	// \note Src layout is used as reference in case of activeUniforms happens to be incorrect in dstLayout blocks.
	int numBlocks = (int)srcLayout.blocks.size();

	for (int srcBlockNdx = 0; srcBlockNdx < numBlocks; srcBlockNdx++)
	{
		const BlockLayoutEntry&		srcBlock	= srcLayout.blocks[srcBlockNdx];
		const void*					srcBlockPtr	= srcBlockPointers.find(srcBlockNdx)->second;
		int							dstBlockNdx	= dstLayout.getBlockIndex(srcBlock.name.c_str());
		void*						dstBlockPtr	= dstBlockNdx >= 0 ? dstBlockPointers.find(dstBlockNdx)->second : DE_NULL;

		if (dstBlockNdx < 0)
			continue;

		for (vector<int>::const_iterator srcUniformNdxIter = srcBlock.activeUniformIndices.begin(); srcUniformNdxIter != srcBlock.activeUniformIndices.end(); srcUniformNdxIter++)
		{
			const UniformLayoutEntry&	srcEntry		= srcLayout.uniforms[*srcUniformNdxIter];
			int							dstUniformNdx	= dstLayout.getUniformIndex(srcEntry.name.c_str());

			if (dstUniformNdx < 0)
				continue;

			copyUniformData(dstLayout.uniforms[dstUniformNdx], dstBlockPtr, srcEntry, srcBlockPtr);
		}
	}
}